

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

uint Kit_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  ushort *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  bool bVar11;
  uint *pOut;
  ulong uVar12;
  uint *local_d8;
  int pStore [32];
  
  uVar7 = 0;
  uVar12 = 0;
  if (0 < nVars) {
    uVar12 = (ulong)(uint)nVars;
  }
  for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    pCanonPerm[uVar7] = (char)uVar7;
  }
  uVar7 = (ulong)(uint)(1 << ((byte)nVars - 5 & 0x1f));
  if (nVars < 6) {
    uVar7 = 1;
  }
  iVar4 = Kit_TruthCountOnes(pInOut,nVars);
  iVar8 = (int)uVar7 * 0x10;
  uVar10 = 0;
  if (iVar4 != iVar8 && SBORROW4(iVar4,iVar8) == iVar4 + (int)uVar7 * -0x10 < 0) {
    for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      pInOut[uVar7 - 1] = ~pInOut[uVar7 - 1];
    }
    uVar10 = 1 << ((byte)nVars & 0x1f);
  }
  Kit_TruthCountOnesInCofs(pInOut,nVars,pStore);
  for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    iVar4 = pStore[uVar7 * 2];
    if (iVar4 < pStore[uVar7 * 2 + 1]) {
      uVar10 = uVar10 | 1 << ((uint)uVar7 & 0x1f);
      pStore[uVar7 * 2] = pStore[uVar7 * 2 + 1];
      pStore[uVar7 * 2 + 1] = iVar4;
      Kit_TruthChangePhase(pInOut,nVars,(uint)uVar7);
    }
  }
  iVar4 = 1;
  if (1 < nVars) {
    iVar4 = nVars;
  }
  bVar9 = true;
  bVar11 = false;
  uVar7 = 0;
  local_d8 = pInOut;
  do {
    while (uVar12 = uVar7, pOut = pAux, pAux = pOut, iVar4 - 1 != uVar12) {
      iVar8 = pStore[uVar12 * 2];
      iVar2 = pStore[uVar12 * 2 + 2];
      uVar7 = uVar12 + 1;
      if (iVar8 < iVar2) {
        puVar1 = (ushort *)(pCanonPerm + uVar12);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        bVar11 = (bool)(bVar11 ^ 1);
        pStore[uVar7 * 2 + -2] = iVar2;
        pStore[uVar7 * 2] = iVar8;
        iVar8 = pStore[uVar7 * 2 + -1];
        pStore[uVar7 * 2 + -1] = pStore[uVar7 * 2 + 1];
        pStore[uVar7 * 2 + 1] = iVar8;
        uVar5 = uVar10 >> ((byte)uVar12 & 0x1f);
        uVar6 = 3 << ((byte)uVar12 & 0x1f);
        if ((((uVar5 & 2) == 0 ^ (byte)uVar5) & 1) != 0) {
          uVar6 = 0;
        }
        uVar10 = uVar10 ^ uVar6;
        Kit_TruthSwapAdjacentVars(pOut,local_d8,nVars,(int)uVar12);
        bVar9 = false;
        pAux = local_d8;
        local_d8 = pOut;
      }
    }
    bVar3 = !bVar9;
    bVar9 = true;
    uVar7 = 0;
  } while (bVar3);
  if (bVar11) {
    Kit_TruthCopy(pOut,local_d8,nVars);
  }
  return uVar10;
}

Assistant:

unsigned Kit_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    int pStore[32];
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Kit_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    nOnes = Kit_TruthCountOnes(pIn, nVars);
    //if(pIn[0] & 1)
    if ( (nOnes > nWords * 16) )//|| ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Kit_TruthCountOnesInCofs( pIn, nVars, pStore );
/*
    Kit_TruthCountOnesInCofsSlow( pIn, nVars, pStore2, pAux );
    for ( i = 0; i < 2*nVars; i++ )
    {
        assert( pStore[i] == pStore2[i] );
    }
*/
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] >= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Kit_TruthChangePhase( pIn, nVars, i );
    }

//    Kit_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] >= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );


/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Kit_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Kit_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Kit_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Kit_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Kit_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}